

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darMan.c
# Opt level: O3

Dar_Man_t * Dar_ManStart(Aig_Man_t *pAig,Dar_RwrPar_t *pPars)

{
  Dar_Man_t *pDVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Aig_MmFixed_t *pAVar4;
  
  Aig_ManCleanData(pAig);
  pDVar1 = (Dar_Man_t *)calloc(1,0xb08);
  pDVar1->pPars = pPars;
  pDVar1->pAig = pAig;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  pVVar2->pArray = ppvVar3;
  pDVar1->vCutNodes = pVVar2;
  pAVar4 = Aig_MmFixedStart(pPars->nCutsMax * 0x18,0x400);
  pDVar1->pMemCuts = pAVar4;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 8;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(0x40);
  pVVar2->pArray = ppvVar3;
  pDVar1->vLeavesBest = pVVar2;
  return pDVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the rewriting manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Dar_Man_t * Dar_ManStart( Aig_Man_t * pAig, Dar_RwrPar_t * pPars )
{
    Dar_Man_t * p;
    Aig_ManCleanData( pAig );
    p = ABC_ALLOC( Dar_Man_t, 1 );
    memset( p, 0, sizeof(Dar_Man_t) );
    p->pPars = pPars;
    p->pAig  = pAig;
    p->vCutNodes = Vec_PtrAlloc( 1000 );
    p->pMemCuts = Aig_MmFixedStart( p->pPars->nCutsMax * sizeof(Dar_Cut_t), 1024 );
    p->vLeavesBest = Vec_PtrAlloc( 4 );
    return p;
}